

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.h
# Opt level: O2

int __thiscall ByteArray::getWord(ByteArray *this,size_t pos,Endianness endianness)

{
  ulong uVar1;
  size_t sVar2;
  
  uVar1 = pos + 1;
  if (this->size_ <= uVar1) {
    return -1;
  }
  sVar2 = pos;
  if (endianness == Little) {
    sVar2 = uVar1;
    uVar1 = pos;
  }
  return (uint)CONCAT11(this->data_[sVar2],this->data_[uVar1]);
}

Assistant:

int getWord(size_t pos, Endianness endianness = Endianness::Little) const
	{
		if (pos+1 >= this->size()) return -1;
		unsigned char* d = (unsigned char*) this->data();

		if (endianness == Endianness::Little)
		{
			return d[pos+0] | (d[pos+1] << 8);
		} else {
			return d[pos+1] | (d[pos+0] << 8);
		}
	}